

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::vkRelaxedRemapFunctionParameter
          (TParseContext *this,TFunction *function,TParameter *param,
          vector<int,_std::allocator<int>_> *newParams)

{
  TType *type;
  anon_class_40_3_39e29585 callback;
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  TString *local_60;
  vector<int,_std::allocator<int>_> *newParams_local;
  TParameter *param_local;
  TFunction *function_local;
  TParseContext *this_local;
  
  (*(function->super_TSymbol)._vptr_TSymbol[0x16])(function,param);
  uVar1 = (*param->type->_vptr_TType[0x25])();
  if (((uVar1 & 1) != 0) && (uVar1 = (*param->type->_vptr_TType[0x36])(), (uVar1 & 1) != 0)) {
    type = param->type;
    if (param->name == (TString *)0x0) {
      iVar2 = (*param->type->_vptr_TType[6])();
      local_60 = (TString *)CONCAT44(extraout_var,iVar2);
    }
    else {
      local_60 = param->name;
    }
    callback.param.name = param->name;
    callback.function = function;
    callback.param.type = param->type;
    callback.param.defaultValue = param->defaultValue;
    callback.newParams = newParams;
    ForEachOpaque<glslang::TParseContext::vkRelaxedRemapFunctionParameter(glslang::TFunction*,glslang::TParameter&,std::vector<int,std::allocator<int>>*)::__0>
              (type,local_60,callback);
  }
  return;
}

Assistant:

void TParseContext::vkRelaxedRemapFunctionParameter(TFunction* function, TParameter& param, std::vector<int>* newParams)
{
    function->addParameter(param);

    if (!param.type->isStruct() || !param.type->containsOpaque())
        return;

    ForEachOpaque(*param.type, (param.name ? *param.name : param.type->getFieldName()),
                  [function, param, newParams](const TType& type, const TString& path) {
                      TString* memberName = NewPoolTString(path.c_str());

                      TType* memberType = new TType();
                      memberType->shallowCopy(type);
                      memberType->getQualifier().storage = param.type->getQualifier().storage;
                      memberType->clearArraySizes();

                      TParameter memberParam = {};
                      memberParam.name = memberName;
                      memberParam.type = memberType;
                      memberParam.defaultValue = nullptr;
                      function->addParameter(memberParam);
                      if (newParams)
                          newParams->push_back(function->getParamCount()-1);
                  });
}